

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_obj.cpp
# Opt level: O0

Mtbdd * __thiscall sylvan::Mtbdd::operator-=(Mtbdd *this,Mtbdd *other)

{
  MTBDD MVar1;
  Mtbdd *other_local;
  Mtbdd *this_local;
  
  MVar1 = mtbdd_apply_RUN(this->mtbdd,other->mtbdd,mtbdd_op_minus_CALL);
  this->mtbdd = MVar1;
  return this;
}

Assistant:

Mtbdd&
Mtbdd::operator-=(const Mtbdd& other)
{
    mtbdd = mtbdd_minus(mtbdd, other.mtbdd);
    return *this;
}